

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O1

void __thiscall
TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,ClassDeclaration *class_declaration)

{
  pointer pcVar1;
  string local_60;
  Symbol local_40;
  
  pcVar1 = (class_declaration->class_name_)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (class_declaration->class_name_)._M_string_length);
  Symbol::Symbol(&local_40,&local_60);
  TraverseToChildByClassSymbol(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name_._M_dataplus._M_p != &local_40.name_.field_2) {
    operator_delete(local_40.name_._M_dataplus._M_p,local_40.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  TemplateVisitor<int>::Accept
            ((TemplateVisitor<int> *)this,(Node *)class_declaration->declarations_);
  this->current_layer_ = this->current_layer_->parent_;
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(ClassDeclaration* class_declaration) {
  TraverseToChildByClassSymbol(Symbol(class_declaration->class_name_));

  Accept(class_declaration->declarations_);

  current_layer_ = current_layer_->parent_;
}